

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::ImGuiTextFilter(ImGuiTextFilter *this,char *default_filter)

{
  this->InputBuf[0] = '\0';
  (this->Filters).Size = 0;
  (this->Filters).Capacity = 0;
  (this->Filters).Data = (ImGuiTextRange *)0x0;
  this->CountGrep = 0;
  if (default_filter != (char *)0x0) {
    strncpy(this->InputBuf,default_filter,0xff);
    this->InputBuf[0xff] = '\0';
    Build(this);
  }
  return;
}

Assistant:

ImGuiTextFilter::ImGuiTextFilter(const char* default_filter) //-V1077
{
    InputBuf[0] = 0;
    CountGrep = 0;
    if (default_filter)
    {
        ImStrncpy(InputBuf, default_filter, IM_ARRAYSIZE(InputBuf));
        Build();
    }
}